

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler3>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler3>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>
           *this)

{
  bool bVar1;
  uint lb;
  int iVar2;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3> *in_RDI;
  int num_terms;
  int index;
  AlgebraicConHandler lh;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::ItemType)2>
  in_stack_fffffffffffffff0;
  
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::
  AlgebraicConHandler::AlgebraicConHandler
            ((AlgebraicConHandler *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>
              *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::
  AlgebraicConHandler::num_items((AlgebraicConHandler *)&stack0xfffffffffffffff0);
  lb = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::
       ReadUInt(in_stack_fffffffffffffff0.reader_,in_stack_ffffffffffffffec);
  iVar2 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::
          ReadUInt(in_stack_fffffffffffffff0.reader_,lb,in_stack_ffffffffffffffe8);
  BinaryReaderBase::ReadTillEndOfLine(&in_RDI->reader_->super_BinaryReaderBase);
  bVar1 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::
          AlgebraicConHandler::SkipExpr((AlgebraicConHandler *)&stack0xfffffffffffffff0,lb);
  if (bVar1) {
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::
    ReadLinearExpr<mp::internal::NullLinearExprHandler>(in_RDI,iVar2);
  }
  else {
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler3>::
    AlgebraicConHandler::OnLinearExpr
              ((AlgebraicConHandler *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    ReadLinearExpr<mp::NLHandler<TestNLHandler3,int>::LinearExprHandler>(in_RDI,iVar2);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}